

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

Matrix<float,_4,_4,_0,_4,_4> *
getGTTransformations<float>(Matrix<float,_4,_4,_0,_4,_4> *__return_storage_ptr__,bool verbose)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  ostream *poVar5;
  Scalar *pSVar6;
  Type local_198;
  Type local_160;
  non_const_type local_128;
  MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
  local_120 [36];
  float local_fc;
  AngleAxis<float> local_f8;
  MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
  local_e8 [36];
  float local_c4;
  AngleAxis<float> local_c0;
  MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
  local_b0 [36];
  float local_8c;
  AngleAxis<float> local_88;
  AngleAxis<float> local_78;
  Eigen local_68 [24];
  undefined1 local_50 [8];
  Matrix<float,_3,_1,_0,_3,_1> tranGT;
  Matrix<float,_3,_3,_0,_3,_3> rotGT;
  float angZ;
  float angY;
  float angX;
  bool verbose_local;
  Matrix<float,_4,_4,_0,_4,_4> *transOut;
  
  angY._3_1_ = verbose;
  _angX = __return_storage_ptr__;
  Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix(__return_storage_ptr__);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity((IdentityReturnType *)&angY,4,4)
  ;
  Eigen::Matrix<float,4,4,0,4,4>::operator=
            ((Matrix<float,4,4,0,4,4> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              *)&angY);
  Eigen::Matrix<float,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<float,_3,_3,_0,_3,_3> *)
             (tranGT.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)local_50);
  iVar4 = rand();
  fVar1 = (float)(iVar4 % 200) / 5.0;
  iVar4 = rand();
  fVar2 = (float)(iVar4 % 200) / 5.0;
  iVar4 = rand();
  fVar3 = (float)(iVar4 % 200) / 5.0;
  if ((angY._3_1_ & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Rand() angles = (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,fVar1);
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,fVar2);
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,fVar3);
    poVar5 = std::operator<<(poVar5,")");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  local_8c = (fVar3 * 3.1415927) / 360.0;
  Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::UnitZ();
  Eigen::AngleAxis<float>::
  AngleAxis<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,3,3,0,3,3>>const,3,1,false>>
            (&local_88,&local_8c,local_b0);
  local_c4 = (fVar2 * 3.1415927) / 360.0;
  Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::UnitY();
  Eigen::AngleAxis<float>::
  AngleAxis<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,3,3,0,3,3>>const,3,1,false>>
            (&local_c0,&local_c4,local_e8);
  Eigen::AngleAxis<float>::operator*(&local_78,&local_88);
  local_fc = (fVar1 * 3.1415927) / 360.0;
  Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::UnitX();
  Eigen::AngleAxis<float>::
  AngleAxis<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,3,3,0,3,3>>const,3,1,false>>
            (&local_f8,&local_fc,local_120);
  Eigen::operator*(local_68,(QuaternionType *)&local_78,&local_f8);
  Eigen::Matrix<float,3,3,0,3,3>::operator=
            ((Matrix<float,3,3,0,3,3> *)
             (tranGT.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),(RotationBase<Eigen::Quaternion<float,_0>,_3> *)local_68);
  if ((angY._3_1_ & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"GT Rotation Matrix: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                                      (tranGT.
                                       super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                                       m_storage.m_data.array + 1));
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  iVar4 = rand();
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)local_50,0);
  *pSVar6 = (float)(iVar4 % 200) / 10.0 - 10.0;
  iVar4 = rand();
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)local_50,1);
  *pSVar6 = (float)(iVar4 % 200) / 10.0 - 10.0;
  iVar4 = rand();
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)local_50,2);
  *pSVar6 = (float)(iVar4 % 200) / 10.0 - 10.0;
  if ((angY._3_1_ & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"GT Translation Vector: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_128 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::transpose
                          ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_50);
    poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                       *)&local_128);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_160,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)__return_storage_ptr__,3,3);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_160,
             (DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
             (tranGT.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
            (&local_198,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)__return_storage_ptr__,3,1);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_198,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_50);
  return __return_storage_ptr__;
}

Assistant:

Matrix<floatPrec, 4, 4> getGTTransformations(bool verbose)
{

  Matrix<floatPrec, 4, 4> transOut;

  // init the output
  transOut = Matrix<floatPrec, 4, 4>::Identity(4, 4);

  floatPrec angX, angY, angZ;
  Matrix<floatPrec, 3, 3> rotGT;
  Matrix<floatPrec, 3, 1> tranGT;

  // generate random angles
  angX = (rand() % 200) / 5.0;
  angY = (rand() % 200) / 5.0;
  angZ = (rand() % 200) / 5.0;
  if (verbose)
    cout << "Rand() angles = (" << angX << "," << angY << "," << angZ << ")" << endl;

  // create a rotation matrix
  rotGT = AngleAxis<floatPrec>(angZ * M_PI / 360, Matrix<floatPrec, 3, 1>::UnitZ()) *
          AngleAxis<floatPrec>(angY * M_PI / 360, Matrix<floatPrec, 3, 1>::UnitY()) *
          AngleAxis<floatPrec>(angX * M_PI / 360, Matrix<floatPrec, 3, 1>::UnitX());
  if (verbose)
    cout << "GT Rotation Matrix: " << endl
         << rotGT << endl;
  // cout << rotGT.transpose()*rotGT << endl;

  // create a translation vector
  tranGT(0) = rand() % 200 / 10.0 - 10.0;
  tranGT(1) = rand() % 200 / 10.0 - 10.0;
  tranGT(2) = rand() % 200 / 10.0 - 10.0;
  if (verbose)
    cout << "GT Translation Vector: " << endl
         << tranGT.transpose() << endl;

  transOut.topLeftCorner(3, 3) = rotGT;
  transOut.topRightCorner(3, 1) = tranGT;

  return transOut;
}